

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mul.c
# Opt level: O2

word zzModW2(word *a,size_t n,word w)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  
  uVar11 = 0;
  uVar10 = -w % w;
  uVar9 = 0;
  while( true ) {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar11;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar9;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar10;
    bVar12 = n == 0;
    n = n - 1;
    if (bVar12) break;
    auVar7 = auVar3 * auVar5 + auVar7;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = auVar7._0_8_;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar10;
    uVar9 = SUB168(auVar4 * auVar6,0);
    uVar11 = uVar9 + a[n];
    uVar9 = SUB168(auVar4 * auVar6,8) + auVar7._8_8_ * uVar10 + (ulong)CARRY8(uVar9,a[n]);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = w;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar11;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = SUB168(auVar2 % auVar1,0);
  auVar8 = auVar3 * auVar5 + auVar8;
  return (auVar8._8_8_ * uVar10 + auVar8._0_8_ % w) % w;
}

Assistant:

word zzModW2(const word a[], size_t n, register word w)
{
	register word r0 = 0;
	register dword r1 = 0;
	register word b;
	// pre
	ASSERT(w > 0);
	ASSERT(w <= WORD_BIT_HALF);
	ASSERT(wwIsValid(a, n));
	// b <- B \mod mod
	b = (WORD_MAX - w + 1) % w;
	// (r1 r0) <- \sum_i a[i] b^i
	while (n--)
	{
		r1 *= b;
		r1 += r0;
		r1 *= b;
		r1 += a[n];
		r0 = (word)r1;
		r1 >>= B_PER_W;
	}
	// нормализация
#ifdef SAFE_FAST
	while (r1 != 0)
	{
		r1 *= b;
		r1 += r0 % w;
		r0 = (word)r1;
		r1 >>= B_PER_W;
	}
	r0 %= w;
#else
	r1 *= b;
	r1 += r0 % w;
	r0 = (word)r1;
	r1 >>= B_PER_W;
	r1 *= b;
	r1 += r0 % w;
	r0 = (word)r1 % w;
#endif
	// очистка и возврат
	r1 = 0, b = w = 0;
	return r0;
}